

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adig.c
# Opt level: O0

void print_opt_binp(uchar *val,size_t val_len)

{
  ares_bool_t aVar1;
  ulong local_20;
  size_t i;
  size_t val_len_local;
  uchar *val_local;
  
  printf("\"");
  for (local_20 = 0; local_20 < val_len; local_20 = local_20 + 1) {
    aVar1 = adig_isprint((uint)val[local_20]);
    if (aVar1 == ARES_FALSE) {
      printf("\\%03d",(ulong)val[local_20]);
    }
    else {
      printf("%c",(ulong)val[local_20]);
    }
  }
  printf("\"");
  return;
}

Assistant:

static void print_opt_binp(const unsigned char *val, size_t val_len)
{
  size_t i;
  printf("\"");
  for (i = 0; i < val_len; i++) {
    if (adig_isprint(val[i])) {
      printf("%c", val[i]);
    } else {
      printf("\\%03d", val[i]);
    }
  }
  printf("\"");
}